

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSLModels.cpp
# Opt level: O3

void __thiscall XPMP2::CSLModel::DecRefCnt(CSLModel *this)

{
  uint uVar1;
  float fVar2;
  
  if (this->refCnt == 0) {
    if (glob < 3) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/CSLModels.cpp"
             ,0x1ef,"DecRefCnt",logWARN,"Reference counter already 0, can\'t be decreaed, for %s",
             (this->cslId)._M_dataplus._M_p);
      return;
    }
  }
  else {
    uVar1 = this->refCnt - 1;
    this->refCnt = uVar1;
    if (uVar1 == 0) {
      fVar2 = GetMiscNetwTime();
      this->refZeroTs = fVar2;
    }
  }
  return;
}

Assistant:

void CSLModel::DecRefCnt ()
 {
     if (refCnt>0) {
         if (--refCnt == 0) {
             // reached zero...remember when for later garbage collection
             refZeroTs = GetMiscNetwTime();
         }
     } else {
         LOG_MSG(logWARN, WARN_REF_CNT_ZERO, cslId.c_str());
     }
 }